

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O2

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  float fVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  uint uVar5;
  uint _c;
  Mat *pMVar6;
  void *pvVar7;
  unsigned_long uVar8;
  pointer pMVar9;
  undefined1 auVar10 [12];
  ulong uVar11;
  ulong uVar12;
  float *pfVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  long lVar16;
  uint _h;
  ulong uVar17;
  pointer pRVar18;
  int iVar19;
  void *pvVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  undefined8 *puVar24;
  size_t j_1;
  undefined8 *puVar25;
  void *pvVar26;
  pointer pRVar27;
  int j;
  int iVar28;
  ulong uVar29;
  uint uVar30;
  void *pvVar31;
  value_type_conflict2 *__x;
  bool bVar32;
  float fVar33;
  float fVar34;
  float fVar38;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  Mat pbs;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  ulong local_1d0;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  Mat proposals;
  void *local_160;
  vector<float,_std::allocator<float>_> scores;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  float local_f8;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = pMVar6->w;
  uVar30 = pMVar6->h;
  _c = (this->anchors).h;
  proposals.elemsize._0_4_ = 0;
  proposals.elemsize._4_4_ = 0;
  proposals.elempack = 0;
  proposals.data = (void *)0x0;
  proposals.refcount._0_4_ = 0;
  proposals.refcount._4_4_ = 0;
  proposals.allocator = (Allocator *)0x0;
  proposals.dims = 0;
  proposals.w = 0;
  proposals.h = 0;
  proposals.c = 0;
  proposals.cstep = 0;
  _h = uVar30 * uVar5;
  uVar22 = 0;
  Mat::create(&proposals,4,_h,_c,4,(Allocator *)0x0);
  uVar11 = 0;
  if (0 < (int)uVar5) {
    uVar11 = (ulong)uVar5;
  }
  this_00 = pMVar6 + 1;
  uVar17 = (ulong)uVar30;
  if ((int)uVar30 < 1) {
    uVar17 = uVar22;
  }
  uVar12 = 0;
  if (0 < (int)_c) {
    uVar12 = (ulong)_c;
  }
  lVar16 = (long)(int)uVar5 * 4;
  for (; uVar22 != uVar12; uVar22 = uVar22 + 1) {
    uVar30 = (int)uVar22 * 4;
    Mat::channel(&pbs,this_00,uVar30);
    local_160 = pbs.data;
    Mat::~Mat(&pbs);
    Mat::channel(&pbs,this_00,uVar30 | 1);
    pvVar20 = pbs.data;
    Mat::~Mat(&pbs);
    Mat::channel(&pbs,this_00,uVar30 | 2);
    pvVar26 = pbs.data;
    Mat::~Mat(&pbs);
    Mat::channel(&pbs,this_00,uVar30 | 3);
    pvVar31 = pbs.data;
    Mat::~Mat(&pbs);
    pbs.elemsize = CONCAT44(proposals.elemsize._4_4_,(undefined4)proposals.elemsize);
    pbs.data = (void *)(proposals.cstep * uVar22 * pbs.elemsize + (long)proposals.data);
    pbs.refcount = (int *)0x0;
    pbs.elempack = proposals.elempack;
    pbs.allocator = proposals.allocator;
    pbs.dims = 2;
    pbs.w = proposals.w;
    pbs.h = proposals.h;
    pbs.c = 1;
    pbs.cstep = (size_t)(proposals.h * proposals.w);
    lVar23 = (long)(int)uVar22 * (long)(this->anchors).w * (this->anchors).elemsize;
    pvVar7 = (this->anchors).data;
    local_f8 = (float)((ulong)*(undefined8 *)((long)pvVar7 + lVar23) >> 0x20);
    uVar3 = *(undefined8 *)((long)pvVar7 + lVar23 + 8);
    fVar39 = (float)uVar3 - (float)*(undefined8 *)((long)pvVar7 + lVar23);
    fVar40 = (float)((ulong)uVar3 >> 0x20) - local_f8;
    local_1c4 = (float)this->feat_stride;
    fVar38 = fVar40 * 0.5;
    lVar21 = (long)proposals.w * pbs.elemsize;
    puVar24 = (undefined8 *)(proposals.cstep * pbs.elemsize * uVar22 + (long)proposals.data);
    for (uVar14 = 0; uVar14 != uVar17; uVar14 = uVar14 + 1) {
      local_1c0 = (float)this->feat_stride;
      fVar41 = *(float *)((long)pvVar7 + lVar23);
      puVar25 = puVar24;
      for (uVar29 = 0; uVar11 != uVar29; uVar29 = uVar29 + 1) {
        local_1bc = *(float *)((long)pvVar31 + uVar29 * 4);
        fVar42 = *(float *)((long)local_160 + uVar29 * 4);
        fVar43 = *(float *)((long)pvVar20 + uVar29 * 4);
        fVar33 = expf(*(float *)((long)pvVar26 + uVar29 * 4));
        fVar34 = expf(local_1bc);
        fVar42 = (fVar42 + 0.5) * fVar39 + fVar41;
        fVar43 = (fVar43 + 0.5) * fVar40 + local_f8;
        fVar33 = fVar33 * fVar39 * 0.5;
        fVar34 = fVar34 * fVar38;
        auVar35._4_4_ = fVar34;
        auVar35._0_4_ = fVar33;
        auVar35._8_4_ = fVar42;
        auVar35._12_4_ = fVar43;
        auVar10._4_8_ = auVar35._8_8_;
        auVar10._0_4_ = fVar34 + local_f8 * fVar38;
        auVar36._0_8_ = auVar10._0_8_ << 0x20;
        auVar36._8_4_ = fVar42 + fVar33;
        auVar36._12_4_ = fVar43 + fVar34;
        *puVar25 = CONCAT44(fVar43 - fVar34,fVar42 - fVar33);
        puVar25[1] = auVar36._8_8_;
        fVar41 = fVar41 + local_1c0;
        puVar25 = (undefined8 *)((long)puVar25 + lVar21);
      }
      local_f8 = local_f8 + local_1c4;
      pvVar31 = (void *)((long)pvVar31 + lVar16);
      pvVar26 = (void *)((long)pvVar26 + lVar16);
      pvVar20 = (void *)((long)pvVar20 + lVar16);
      local_160 = (void *)((long)local_160 + lVar16);
      puVar24 = (undefined8 *)((long)puVar24 + lVar21 * (int)uVar5);
    }
    Mat::~Mat(&pbs);
  }
  fVar38 = (float)*pMVar6[2].data;
  fVar39 = (float)((ulong)*pMVar6[2].data >> 0x20);
  uVar22 = 0;
  uVar11 = (ulong)_h;
  if ((int)_h < 1) {
    uVar11 = uVar22;
  }
  for (; uVar22 != uVar12; uVar22 = uVar22 + 1) {
    pbs.elemsize = CONCAT44(proposals.elemsize._4_4_,(undefined4)proposals.elemsize);
    pbs.data = (void *)(proposals.cstep * uVar22 * pbs.elemsize + (long)proposals.data);
    pbs.refcount = (int *)0x0;
    pbs.elempack = proposals.elempack;
    pbs.allocator = proposals.allocator;
    pbs.dims = 2;
    pbs.w = proposals.w;
    pbs.h = proposals.h;
    pbs.c = 1;
    pbs.cstep = (size_t)(proposals.h * proposals.w);
    pauVar15 = (undefined1 (*) [16])(proposals.cstep * pbs.elemsize * uVar22 + (long)proposals.data)
    ;
    uVar17 = uVar11;
    while (bVar32 = uVar17 != 0, uVar17 = uVar17 - 1, bVar32) {
      auVar37._4_4_ = fVar38 + -1.0;
      auVar37._0_4_ = fVar39 + -1.0;
      auVar37._8_4_ = fVar39 + -1.0;
      auVar37._12_4_ = fVar38 + -1.0;
      auVar37 = minps(*pauVar15,auVar37);
      auVar37 = maxps(auVar37,ZEXT816(0));
      *pauVar15 = auVar37;
      pauVar15 = (undefined1 (*) [16])(*pauVar15 + (long)proposals.w * pbs.elemsize);
    }
    Mat::~Mat(&pbs);
  }
  proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  fVar38 = (float)this->min_size * *(float *)((long)pMVar6[2].data + 8);
  for (uVar22 = 0; uVar22 != uVar12; uVar22 = uVar22 + 1) {
    pbs.elemsize = CONCAT44(proposals.elemsize._4_4_,(undefined4)proposals.elemsize);
    pbs.data = (void *)(proposals.cstep * uVar22 * pbs.elemsize + (long)proposals.data);
    pbs.refcount = (int *)0x0;
    pbs.elempack = proposals.elempack;
    pbs.allocator = proposals.allocator;
    pbs.dims = 2;
    pbs.w = proposals.w;
    pbs.h = proposals.h;
    pbs.c = 1;
    pbs.cstep = (size_t)(proposals.h * proposals.w);
    Mat::channel((Mat *)&picked,pMVar6,_c + (int)uVar22);
    __x = (value_type_conflict2 *)
          picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start;
    Mat::~Mat((Mat *)&picked);
    for (uVar17 = 0; uVar11 != uVar17; uVar17 = uVar17 + 1) {
      lVar16 = (long)(int)uVar17 * (long)pbs.w * pbs.elemsize;
      if ((fVar38 <= (*(float *)((long)pbs.data + lVar16 + 8) + 1.0) -
                     *(float *)((long)pbs.data + lVar16)) &&
         (fVar38 <= (*(float *)((long)pbs.data + lVar16 + 0xc) + 1.0) -
                    *(float *)((long)pbs.data + lVar16 + 4))) {
        picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(*(undefined4 *)((long)pbs.data + lVar16 + 4),
                               *(float *)((long)pbs.data + lVar16));
        picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(*(undefined4 *)((long)pbs.data + lVar16 + 0xc),
                               *(undefined4 *)((long)pbs.data + lVar16 + 8));
        std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::push_back
                  (&proposal_boxes,(value_type *)&picked);
        std::vector<float,_std::allocator<float>_>::push_back(&scores,__x);
      }
      __x = __x + 1;
    }
    Mat::~Mat(&pbs);
  }
  if (proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start !=
      proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      qsort_descent_inplace<ncnn::Rect>
                (&proposal_boxes,&scores,0,
                 (int)((ulong)((long)scores.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)scores.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                    .super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  iVar19 = this->pre_nms_topN;
  if ((0 < (long)iVar19) &&
     (iVar19 < (int)((ulong)((long)proposal_boxes.
                                   super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)proposal_boxes.
                                  super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 4))) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize(&proposal_boxes,(long)iVar19);
    std::vector<float,_std::allocator<float>_>::resize(&scores,(long)this->pre_nms_topN);
  }
  picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fVar38 = this->nms_thresh;
  uVar22 = (long)proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&pbs,uVar22,(allocator_type *)&local_1d0);
  pfVar13 = &(proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_start)->x2;
  for (uVar11 = 0; uVar22 != uVar11; uVar11 = uVar11 + 1) {
    uVar2 = ((Rect *)(pfVar13 + -2))->x1;
    uVar4 = ((Rect *)(pfVar13 + -2))->y1;
    *(float *)((long)pbs.data + uVar11 * 4) =
         ((float)((ulong)*(undefined8 *)pfVar13 >> 0x20) - (float)uVar4) *
         ((float)*(undefined8 *)pfVar13 - (float)uVar2);
    pfVar13 = pfVar13 + 4;
  }
  for (local_1d0 = 0; local_1d0 < uVar22; local_1d0 = local_1d0 + 1) {
    pRVar18 = proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_start + local_1d0;
    bVar32 = true;
    for (lVar16 = 0;
        (long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != lVar16; lVar16 = lVar16 + 1) {
      uVar8 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16];
      fVar39 = pRVar18->x1;
      fVar40 = proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8].x2;
      fVar41 = 0.0;
      if (fVar39 <= fVar40) {
        pRVar27 = proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl
                  .super__Vector_impl_data._M_start + uVar8;
        fVar42 = pRVar18->x2;
        fVar43 = pRVar27->x1;
        if (fVar43 <= fVar42) {
          fVar33 = pRVar18->y1;
          fVar34 = pRVar27->y2;
          if (fVar33 <= fVar34) {
            fVar1 = pRVar18->y2;
            fVar44 = pRVar27->y1;
            if (fVar44 <= fVar1) {
              if (fVar42 <= fVar40) {
                fVar40 = fVar42;
              }
              if (fVar43 <= fVar39) {
                fVar43 = fVar39;
              }
              if (fVar1 <= fVar34) {
                fVar34 = fVar1;
              }
              if (fVar44 <= fVar33) {
                fVar44 = fVar33;
              }
              fVar41 = (fVar34 - fVar44) * (fVar40 - fVar43);
            }
          }
        }
      }
      if (fVar38 < fVar41 / ((*(float *)((long)pbs.data + local_1d0 * 4) - fVar41) +
                            *(float *)((long)pbs.data + uVar8 * 4))) {
        bVar32 = false;
      }
    }
    if (bVar32) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&picked,&local_1d0);
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&pbs);
  uVar11 = (ulong)((long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar22 = uVar11 & 0xffffffff;
  if (this->after_nms_topN < (int)uVar11) {
    uVar22 = (ulong)(uint)this->after_nms_topN;
  }
  pMVar6 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar19 = (int)uVar22;
  Mat::create(pMVar6,4,1,iVar19,4,(Allocator *)0x0);
  if ((pMVar6->data == (void *)0x0) || ((long)pMVar6->c * pMVar6->cstep == 0)) {
    iVar28 = -100;
  }
  else {
    uVar17 = 0;
    uVar11 = 0;
    if (0 < iVar19) {
      uVar11 = uVar22;
    }
    for (; uVar11 != uVar17; uVar17 = uVar17 + 1) {
      Mat::channel(&pbs,pMVar6,(int)uVar17);
      pvVar7 = pbs.data;
      Mat::~Mat(&pbs);
      uVar8 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17];
      *(float *)pvVar7 =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8].x1;
      *(float *)((long)pvVar7 + 4) =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8].y1;
      *(float *)((long)pvVar7 + 8) =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8].x2;
      *(float *)((long)pvVar7 + 0xc) =
           proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8].y2;
    }
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar28 = 0;
    if (0x40 < (ulong)((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9)) {
      pMVar6 = pMVar9 + 1;
      Mat::create(pMVar6,1,1,iVar19,4,(Allocator *)0x0);
      if (pMVar6->data == (void *)0x0) {
        iVar28 = -100;
      }
      else {
        iVar28 = -100;
        if ((long)pMVar9[1].c * pMVar9[1].cstep != 0) {
          iVar28 = 0;
          for (uVar22 = 0; uVar11 != uVar22; uVar22 = uVar22 + 1) {
            Mat::channel(&pbs,pMVar6,(int)uVar22);
            pvVar7 = pbs.data;
            Mat::~Mat(&pbs);
            *(float *)pvVar7 =
                 scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar22]];
          }
        }
      }
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&scores.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>::~_Vector_base
            (&proposal_boxes.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>);
  Mat::~Mat(&proposals);
  return iVar28;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i*w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = static_cast<float>(anchor_w * exp(dw));
                float pb_h = static_cast<float>(anchor_h * exp(dh));

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = { pb[0], pb[1], pb[2], pb[3] };
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<size_t> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i=0; i<picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[ picked[i] ].x1;
        outptr[1] = proposal_boxes[ picked[i] ].y1;
        outptr[2] = proposal_boxes[ picked[i] ].x2;
        outptr[3] = proposal_boxes[ picked[i] ].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i=0; i<picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[ picked[i] ];
        }
    }

    return 0;
}